

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_cmd_array.c
# Opt level: O1

nsh_status_t nsh_cmd_array_lexicographic_sort(nsh_cmd_array_t *cmds)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *__s2;
  ulong uVar5;
  char *local_40;
  
  if (cmds->count != 1) {
    local_40 = cmds->array[1].name;
    uVar5 = 1;
    uVar3 = 0;
    do {
      uVar1 = uVar3 + 1;
      if (uVar1 < cmds->count) {
        uVar4 = uVar5;
        __s2 = local_40;
        do {
          iVar2 = strcmp(cmds->array[uVar3].name,__s2);
          if (0 < iVar2) {
            nsh_cmd_swap(cmds->array + uVar3,(nsh_cmd_t *)(__s2 + -8));
          }
          uVar4 = uVar4 + 1;
          __s2 = __s2 + 0x18;
        } while (uVar4 < cmds->count);
      }
      uVar5 = uVar5 + 1;
      local_40 = local_40 + 0x18;
      uVar3 = uVar1;
    } while (uVar1 < cmds->count - 1);
  }
  return NSH_STATUS_OK;
}

Assistant:

nsh_status_t nsh_cmd_array_lexicographic_sort(nsh_cmd_array_t* cmds)
{
    for (unsigned int i = 0; i < cmds->count - 1; ++i) {
        for (unsigned int j = i + 1; j < cmds->count; ++j) {
            if (strcmp(cmds->array[i].name, cmds->array[j].name) > 0) {
                nsh_cmd_swap(&cmds->array[i], &cmds->array[j]);
            }
        }
    }
    return NSH_STATUS_OK;
}